

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

bool __thiscall
QTableModel::removeColumns(QTableModel *this,int column,int count,QModelIndex *param_3)

{
  QTableWidgetItem *pQVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  int iVar5;
  int h;
  char *pcVar6;
  long lVar7;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((column < 0 || count < 1) ||
     ((ulong)(this->horizontalHeaderItems).d.size < (ulong)(uint)(count + column))) {
    bVar4 = false;
  }
  else {
    local_50 = 0xffffffffffffffff;
    local_48 = 0;
    uStack_40 = 0;
    QAbstractItemModel::beginRemoveColumns((QModelIndex *)this,(int)&local_50,column);
    local_50 = 0xffffffffffffffff;
    local_48 = 0;
    uStack_40 = 0;
    iVar5 = (**(code **)(*(long *)this + 0x78))(this,&local_50);
    while (pcVar6 = (char *)(ulong)(uint)column, 0 < iVar5) {
      iVar5 = iVar5 + -1;
      iVar3 = (int)(this->horizontalHeaderItems).d.size;
      iVar2 = iVar3 * iVar5 + column;
      for (lVar7 = (long)(iVar3 * iVar5 + column); lVar7 < count + iVar2; lVar7 = lVar7 + 1) {
        pQVar1 = (this->tableItems).d.ptr[lVar7];
        if (pQVar1 != (QTableWidgetItem *)0x0) {
          pQVar1->view = (QTableWidget *)0x0;
          (*pQVar1->_vptr_QTableWidgetItem[1])();
        }
      }
      QList<QTableWidgetItem_*>::remove(&this->tableItems,(char *)(long)iVar2);
    }
    for (; (int)pcVar6 < count + column; pcVar6 = pcVar6 + 1) {
      pQVar1 = (this->horizontalHeaderItems).d.ptr[(long)pcVar6];
      if (pQVar1 != (QTableWidgetItem *)0x0) {
        pQVar1->view = (QTableWidget *)0x0;
        (*pQVar1->_vptr_QTableWidgetItem[1])();
      }
    }
    QList<QTableWidgetItem_*>::remove(&this->horizontalHeaderItems,(char *)(ulong)(uint)column);
    QAbstractItemModel::endRemoveColumns();
    bVar4 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QTableModel::removeColumns(int column, int count, const QModelIndex &)
{
    if (count < 1 || column < 0 || column + count >  horizontalHeaderItems.size())
        return false;

    beginRemoveColumns(QModelIndex(), column, column + count - 1);
    QTableWidgetItem *oldItem = nullptr;
    for (int row = rowCount() - 1; row >= 0; --row) {
        int i = tableIndex(row, column);
        for (int j = i; j < i + count; ++j) {
            oldItem = tableItems.at(j);
            if (oldItem)
                oldItem->view = nullptr;
            delete oldItem;
        }
        tableItems.remove(i, count);
    }
    for (int h=column; h<column+count; ++h) {
        oldItem = horizontalHeaderItems.at(h);
        if (oldItem)
            oldItem->view = nullptr;
        delete oldItem;
    }
    horizontalHeaderItems.remove(column, count);
    endRemoveColumns();
    return true;
}